

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_sqlite3.c
# Opt level: O2

uint64_t mm_sql_read_uint64(void *db,char *sql)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  uint64_t uStack_30;
  sqlite3_stmt *res;
  
  res = (sqlite3_stmt *)0x0;
  iVar1 = sqlite3_prepare_v2((sqlite3 *)db,sql,-1,&res,(char **)0x0);
  __stream = _stderr;
  if (iVar1 == 0) {
    sqlite3_step(res);
    uStack_30 = sqlite3_column_int64(res,0);
  }
  else {
    pcVar2 = sqlite3_errmsg((sqlite3 *)db);
    fprintf(__stream,"%s: Failed to prepare: \nSQL: \'%s\'\nError: %s","mm_sql_read_uint64",sql,
            pcVar2);
    uStack_30 = 0xffffffffffffffff;
  }
  sqlite3_finalize(res);
  return uStack_30;
}

Assistant:

uint64_t mm_sql_read_uint64(void* db, const char* sql) {
    sqlite3_stmt* res = NULL;
    uint64_t val = 0L;
    int rc = sqlite3_prepare_v2((sqlite3*)db, sql, -1, &res, 0);

    if (rc != SQLITE_OK) {
        fprintf(stderr, "%s: Failed to prepare: \nSQL: '%s'\nError: %s", __func__, sql, sqlite3_errmsg((sqlite3 *)(db)));
        sqlite3_finalize(res);
        return 0xFFFFFFFFFFFFFFFFLL;
    }

    sqlite3_step(res);

    val = (uint64_t)sqlite3_column_int64(res, 0);

    sqlite3_finalize(res);

    return (val);
}